

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  size_t _str;
  TextAttributes *pTVar1;
  ostream *poVar2;
  TextAttributes local_a0;
  Text local_80;
  long local_28;
  size_t i;
  size_t indent_local;
  string *_string_local;
  ConsoleReporter *this_local;
  
  i = indent;
  indent_local = (size_t)_string;
  _string_local = (string *)this;
  local_28 = std::__cxx11::string::find((char *)_string,0x1695f7);
  _str = indent_local;
  if (local_28 == -1) {
    local_28 = 0;
  }
  else {
    local_28 = local_28 + 2;
  }
  poVar2 = (this->super_StreamingReporterBase).stream;
  Tbc::TextAttributes::TextAttributes(&local_a0);
  pTVar1 = Tbc::TextAttributes::setIndent(&local_a0,i + local_28);
  pTVar1 = Tbc::TextAttributes::setInitialIndent(pTVar1,i);
  Tbc::Text::Text(&local_80,(string *)_str,pTVar1);
  poVar2 = Tbc::operator<<(poVar2,&local_80);
  std::operator<<(poVar2,"\n");
  Tbc::Text::~Text(&local_80);
  return;
}

Assistant:

void printHeaderString( std::string const& _string, std::size_t indent = 0 ) {
            std::size_t i = _string.find( ": " );
            if( i != std::string::npos )
                i+=2;
            else
                i = 0;
            stream << Text( _string, TextAttributes()
                                        .setIndent( indent+i)
                                        .setInitialIndent( indent ) ) << "\n";
        }